

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O0

void __thiscall TldDSAsKey::Add(TldDSAsKey *this,TldDSAsKey *key)

{
  bool bVar1;
  uint local_24;
  uint32_t j;
  bool is_found;
  uint32_t i;
  TldDSAsKey *key_local;
  TldDSAsKey *this_local;
  
  this->count = key->count + this->count;
  this->ds_count = key->ds_count + this->ds_count;
  j = 0;
  do {
    if (key->algo_nb <= j) {
      return;
    }
    bVar1 = false;
    for (local_24 = 0; local_24 < this->algo_nb; local_24 = local_24 + 1) {
      if (this->algo_code[local_24] == key->algo_code[j]) {
        this->algo_count[local_24] = key->algo_count[j] + this->algo_count[local_24];
        bVar1 = true;
        break;
      }
    }
    if ((!bVar1) && (this->algo_nb < 8)) {
      this->algo_code[this->algo_nb] = key->algo_code[j];
      this->algo_count[this->algo_nb] = key->algo_count[j];
      this->algo_nb = this->algo_nb + 1;
    }
    j = j + 1;
  } while( true );
}

Assistant:

void TldDSAsKey::Add(TldDSAsKey * key)
{
    count += key->count;
    ds_count += key->ds_count;
    for (uint32_t i = 0; i < key->algo_nb; i++) {
        bool is_found = false;
        for (uint32_t j = 0; j < algo_nb; j++) {
            if (algo_code[j] == key->algo_code[i]) {
                algo_count[j] += key->algo_count[i];
                is_found = true;
                break;
            }
        }
        if (!is_found && algo_nb < 8) {
            algo_code[algo_nb] = key->algo_code[i];
            algo_count[algo_nb] = key->algo_count[i];
            algo_nb++;
        }
    }
}